

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O1

void AddCoins(CCoinsViewCache *cache,CTransaction *tx,int nHeight,bool check_for_overwrite)

{
  pointer pCVar1;
  bool bVar2;
  undefined1 possible_overwrite;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  Coin local_98;
  COutPoint local_68;
  long local_38;
  int iVar3;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CTransaction::IsCoinBase(tx);
  if ((tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_finish !=
      (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    lVar5 = 8;
    uVar4 = 0;
    do {
      possible_overwrite = bVar2;
      if (check_for_overwrite) {
        local_98.out.nValue = *(CAmount *)(tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
        ;
        local_98.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
             (char *)*(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
        ;
        local_98.out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity =
             *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
        local_98.out.scriptPubKey.super_CScriptBase._union._12_4_ =
             *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x14);
        local_98.out.scriptPubKey.super_CScriptBase._union._16_4_ =
             *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
        local_98.out.scriptPubKey.super_CScriptBase._union._20_4_ =
             *(undefined4 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x1c);
        local_98.out.scriptPubKey.super_CScriptBase._union._24_4_ = (uint32_t)uVar4;
        iVar3 = (*(cache->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[1])
                          (cache,&local_98);
        possible_overwrite = (undefined1)iVar3;
      }
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
      local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((tx->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
      pCVar1 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_98.out.nValue = *(CAmount *)((long)pCVar1 + lVar5 + -8);
      local_68.n = (uint32_t)uVar4;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                (&local_98.out.scriptPubKey.super_CScriptBase,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)((long)&pCVar1->nValue + lVar5)
                );
      local_98._40_4_ = (uint)bVar2 + nHeight * 2;
      CCoinsViewCache::AddCoin(cache,&local_68,&local_98,(bool)possible_overwrite);
      if (0x1c < local_98.out.scriptPubKey.super_CScriptBase._size) {
        free(local_98.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
        local_98.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x28;
    } while (uVar4 < (ulong)(((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddCoins(CCoinsViewCache& cache, const CTransaction &tx, int nHeight, bool check_for_overwrite) {
    bool fCoinbase = tx.IsCoinBase();
    const Txid& txid = tx.GetHash();
    for (size_t i = 0; i < tx.vout.size(); ++i) {
        bool overwrite = check_for_overwrite ? cache.HaveCoin(COutPoint(txid, i)) : fCoinbase;
        // Coinbase transactions can always be overwritten, in order to correctly
        // deal with the pre-BIP30 occurrences of duplicate coinbase transactions.
        cache.AddCoin(COutPoint(txid, i), Coin(tx.vout[i], nHeight, fCoinbase), overwrite);
    }
}